

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstate.c
# Opt level: O1

int lua_closethread(lua_State *L,lua_State *from)

{
  byte bVar1;
  uint uVar2;
  
  if (from == (lua_State *)0x0) {
    uVar2 = 0;
  }
  else {
    uVar2 = (uint)(ushort)from->nCcalls;
  }
  L->nCcalls = uVar2;
  bVar1 = luaE_resetthread(L,L->status);
  return (int)bVar1;
}

Assistant:

LUA_API int lua_closethread (lua_State *L, lua_State *from) {
  TStatus status;
  lua_lock(L);
  L->nCcalls = (from) ? getCcalls(from) : 0;
  status = luaE_resetthread(L, L->status);
  lua_unlock(L);
  return APIstatus(status);
}